

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::repl::repl(repl *this,context_t *c)

{
  element_type *peVar1;
  element_type *peVar2;
  var *in_RSI;
  char (*in_RDI) [5];
  domain_manager *unaff_retaddr;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff88;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff90;
  stack_type<cs::method_base_*,_std::allocator> *in_stack_ffffffffffffffa0;
  char (*pacVar3) [5];
  undefined1 request_fold;
  anon_class_1_0_00000001 *func;
  char (*name) [5];
  
  pacVar3 = in_RDI;
  name = in_RDI;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)0x1c7c1a);
  func = (anon_class_1_0_00000001 *)(pacVar3 + 0x10);
  stack_type<cs::method_base_*,_std::allocator>::stack_type(in_stack_ffffffffffffffa0);
  request_fold = (undefined1)((ulong)pacVar3 >> 0x38);
  *(char *)((long)(in_RDI + 0x18) + 0) = '\x01';
  *(char *)((long)(in_RDI + 0x18) + 1) = '\0';
  *(char *)((long)(in_RDI + 0x18) + 2) = '\0';
  *(char *)((long)(in_RDI + 0x18) + 3) = '\0';
  *(undefined8 *)(in_RDI[0x19] + 3) = 0;
  in_RDI[0x1b][1] = '\0';
  std::__cxx11::string::string((string *)(in_RDI[0x1c] + 4));
  std::__cxx11::string::string((string *)(in_RDI[0x23] + 1));
  std::shared_ptr<cs::context_type>::shared_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  in_RDI[0x2c][4] = '\x01';
  peVar1 = std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1c7ca5);
  std::__cxx11::string::operator=((string *)&peVar1->file_path,"<REPL_ENV>");
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c7ccf);
  peVar2 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1c7cd7);
  peVar2->fold_expr = false;
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c7ce7);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c7cf3);
  make_cni<cs::repl::repl(std::shared_ptr<cs::context_type>)::__0>(func,(bool)request_fold);
  domain_manager::add_buildin_var<char_const(&)[5]>(unaff_retaddr,name,in_RSI);
  cs_impl::any::~any((any *)0x1c7d31);
  return;
}

Assistant:

repl::repl(context_t c) : context(std::move(c))
	{
		context->file_path = "<REPL_ENV>";
		context->compiler->fold_expr = false;
		context->instance->storage.add_buildin_var("quit", cs::make_cni([]() {
			int code = 0;
			cs::current_process->on_process_exit.touch(&code);
		}));
	}